

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O2

Operand * literal(Operand *__return_storage_ptr__,int i)

{
  string local_30;
  
  std::__cxx11::to_string(&local_30,i);
  Operand::Operand(__return_storage_ptr__,literal,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

Operand literal(int i) {
	return Operand(Operand::Type::literal, std::to_string(i));
}